

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

boolean obstructed(int x,int y)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  obj *poVar4;
  char *local_30;
  monst *local_28;
  monst *mtmp;
  int y_local;
  int x_local;
  
  if ((level->monsters[x][y] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
    local_28 = (monst *)0x0;
  }
  else {
    local_28 = level->monsters[x][y];
  }
  if ((local_28 == (monst *)0x0) || (local_28->m_ap_type == '\x01')) {
    if (level->objects[x][y] == (obj *)0x0) {
      return '\0';
    }
LAB_00201111:
    pline("Something\'s in the way.");
    return '\x01';
  }
  if (local_28->m_ap_type == '\x02') goto LAB_00201111;
  if (local_28->wormno == '\0') {
    if (((viz_array[local_28->my][local_28->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((local_28->data->mflags3 & 0x200) != 0 &&
          ((viz_array[local_28->my][local_28->mx] & 1U) != 0)))))))) goto LAB_00200aa1;
LAB_00200b2e:
    if (((((local_28->data->mflags1 & 0x10000) == 0) &&
         ((poVar4 = which_armor(local_28,4), poVar4 == (obj *)0x0 ||
          (poVar4 = which_armor(local_28,4), poVar4->otyp != 0x4f)))) &&
        (((((u.uprops[0x1e].intrinsic != 0 ||
            (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
             (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
           (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
            ((((u.uprops[0x19].intrinsic != 0 ||
               ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
              (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
          (u.uprops[0x19].blocked == 0)) ||
         (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
          (iVar3 = dist2((int)local_28->mx,(int)local_28->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)))))
        ) || (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
              (bVar1 = match_warn_of_mon(local_28), bVar1 != '\0')))) goto LAB_00200cfe;
    local_30 = "Some creature";
  }
  else {
    bVar1 = worm_known(level,local_28);
    if (bVar1 == '\0') goto LAB_00200b2e;
LAB_00200aa1:
    if (((((((*(uint *)&local_28->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        (((*(uint *)&local_28->field_0x60 >> 7 & 1) != 0 ||
         ((*(uint *)&local_28->field_0x60 >> 9 & 1) != 0)))) || (((byte)u._1052_1_ >> 5 & 1) != 0))
    goto LAB_00200b2e;
LAB_00200cfe:
    local_30 = Monnam(local_28);
  }
  pline("%s stands in the way!",local_30);
  if (local_28->wormno == '\0') {
    if ((viz_array[local_28->my][local_28->mx] & 2U) == 0) {
      if ((((((u.uprops[0x1e].intrinsic != 0) ||
             ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
           ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
          ((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))))) ||
         ((local_28->data->mflags3 & 0x200) == 0)) goto LAB_00200f06;
      bVar2 = viz_array[local_28->my][local_28->mx] & 1;
      goto joined_r0x00200e73;
    }
  }
  else {
    bVar2 = worm_known(level,local_28);
joined_r0x00200e73:
    if (bVar2 == 0) goto LAB_00200f06;
  }
  if (((((((*(uint *)&local_28->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
        (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
      (((*(uint *)&local_28->field_0x60 >> 7 & 1) == 0 &&
       ((*(uint *)&local_28->field_0x60 >> 9 & 1) == 0)))) && (((byte)u._1052_1_ >> 5 & 1) == 0)) {
    return '\x01';
  }
LAB_00200f06:
  if (((((local_28->data->mflags1 & 0x10000) != 0) ||
       ((poVar4 = which_armor(local_28,4), poVar4 != (obj *)0x0 &&
        (poVar4 = which_armor(local_28,4), poVar4->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
        (((((u.uprops[0x19].intrinsic == 0 &&
            ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
           (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
         (u.uprops[0x19].blocked != 0)))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar3 = dist2((int)local_28->mx,(int)local_28->my,(int)u.ux,(int)u.uy), 0x40 < iVar3))))))
     && (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
         (bVar1 = match_warn_of_mon(local_28), bVar1 == '\0')))) {
    map_invisible(local_28->mx,local_28->my);
  }
  return '\x01';
}

Assistant:

static boolean obstructed(int x, int y)
{
	struct monst *mtmp = m_at(level, x, y);

	if (mtmp && mtmp->m_ap_type != M_AP_FURNITURE) {
		if (mtmp->m_ap_type == M_AP_OBJECT) goto objhere;
		pline("%s stands in the way!", !canspotmon(level, mtmp) ?
			"Some creature" : Monnam(mtmp));
		if (!canspotmon(level, mtmp))
		    map_invisible(mtmp->mx, mtmp->my);
		return TRUE;
	}
	if (OBJ_AT(x, y)) {
objhere:	pline("Something's in the way.");
		return TRUE;
	}
	return FALSE;
}